

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSurfaceNurbs.cpp
# Opt level: O2

void __thiscall
chrono::geometry::ChSurfaceNurbs::ArchiveIN(ChSurfaceNurbs *this,ChArchiveIn *marchive)

{
  ChNameValue<int> local_48;
  ChNameValue<int> local_30;
  
  ChArchiveIn::VersionRead<chrono::geometry::ChSurfaceNurbs>(marchive);
  ChSurface::ArchiveIN(&this->super_ChSurface,marchive);
  local_30._value = &this->p_u;
  local_30._name = "p_u";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->p_v;
  local_48._name = "p_v";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  return;
}

Assistant:

void ChSurfaceNurbs::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChSurfaceNurbs>();
    // deserialize parent class
    ChSurface::ArchiveIN(marchive);
    // stream in all member data:
    ////marchive >> CHNVP(points);
    ////marchive >> CHNVP(weights);
    ////marchive >> CHNVP(knots_u);
    ////marchive >> CHNVP(knots_v);
    marchive >> CHNVP(p_u);
    marchive >> CHNVP(p_v);
}